

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

MetaIterator * __thiscall rtosc::Port::MetaIterator::operator++(MetaIterator *this)

{
  char *pcVar1;
  MetaIterator *in_RDI;
  bool bVar2;
  char prev;
  char local_11;
  
  if ((in_RDI->title == (char *)0x0) || (*in_RDI->title == '\0')) {
    in_RDI->title = (char *)0x0;
  }
  else {
    local_11 = '\0';
    while( true ) {
      bVar2 = true;
      if ((local_11 == '\0') && (bVar2 = false, *in_RDI->title != '\0')) {
        bVar2 = *in_RDI->title != ':';
      }
      if (!bVar2) break;
      pcVar1 = in_RDI->title;
      in_RDI->title = pcVar1 + 1;
      local_11 = *pcVar1;
    }
    if (*in_RDI->title == '\0') {
      in_RDI->title = (char *)0x0;
    }
    else {
      in_RDI->title = in_RDI->title + 1;
    }
    metaiterator_advance(&in_RDI->title,&in_RDI->value);
  }
  return in_RDI;
}

Assistant:

Port::MetaIterator& Port::MetaIterator::operator++(void)
{
    if(!title || !*title) {
        title = NULL;
        return *this;
    }
    //search for next parameter start
    //aka "\0:" unless "\0\0" is seen
    char prev = 0;
    while(prev || (*title && *title != ':'))
        prev = *title++;

    if(!*title)
        title = NULL;
    else
        ++title;

    metaiterator_advance(title, value);
    return *this;
}